

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.cpp
# Opt level: O0

bool WriteDSK(FILE *f_,shared_ptr<Disk> *disk)

{
  bool bVar1;
  bool bVar2;
  Track *track_00;
  EDSK_HEADER *pEVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  DataRate DVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  char *__src;
  element_type *peVar12;
  exception *peVar13;
  uint8_t *puVar14;
  Sector *pSVar15;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  uchar *puVar16;
  unsigned_short *__ptr;
  size_type __size;
  size_t sVar17;
  bool bVar18;
  Encoding local_3dc;
  DataRate local_3cc;
  undefined1 local_3b8;
  undefined1 local_3b4;
  undefined7 local_320;
  undefined1 uStack_319;
  EDSK_OFFSETS eo;
  Data *data;
  char *pcStack_2f8;
  int copy;
  char *local_2f0;
  int local_2e8;
  int local_2e4;
  int real_size;
  int data_size;
  int num_copies;
  uint8_t status2;
  uint8_t status1;
  int local_2cc;
  int local_2c8;
  int track_capacity;
  int rpm_time;
  int local_2bc;
  Sector sector;
  uint8_t *puStack_278;
  int i;
  uint8_t *pb;
  int uFitSize;
  bool fFitErrorSize;
  bool fFitErrorCopies;
  Encoding EStack_264;
  bool fFitLegacy;
  int track_size;
  Encoding encoding;
  DataRate datarate;
  int track_header_size;
  undefined8 uStack_250;
  Sector local_248;
  undefined1 local_208 [8];
  Sector typical;
  EDSK_SECTOR *ps;
  EDSK_TRACK *pt;
  Track *pTStack_1b0;
  bool added_sector_offsets;
  Track *track;
  CylHead cylhead;
  uint8_t head;
  uint8_t cyl;
  vector<unsigned_short,_std::allocator<unsigned_short>_> offsets;
  bool add_offsets_block;
  string local_170;
  ulong local_150;
  unsigned_long max_cyls;
  uint8_t *pbIndex;
  EDSK_HEADER *peh;
  uint8_t abHeader [256];
  uint8_t *pbTrack;
  MEMORY mem;
  shared_ptr<Disk> *disk_local;
  FILE *f__local;
  
  mem.pb = (uint8_t *)disk;
  MEMORY::MEMORY((MEMORY *)&pbTrack,0xff00);
  abHeader._248_8_ = mem._8_8_;
  abHeader[0xe8] = '\0';
  abHeader[0xe9] = '\0';
  abHeader[0xea] = '\0';
  abHeader[0xeb] = '\0';
  abHeader[0xec] = '\0';
  abHeader[0xed] = '\0';
  abHeader[0xee] = '\0';
  abHeader[0xef] = '\0';
  abHeader[0xf0] = '\0';
  abHeader[0xf1] = '\0';
  abHeader[0xf2] = '\0';
  abHeader[0xf3] = '\0';
  abHeader[0xf4] = '\0';
  abHeader[0xf5] = '\0';
  abHeader[0xf6] = '\0';
  abHeader[0xf7] = '\0';
  abHeader[0xd8] = '\0';
  abHeader[0xd9] = '\0';
  abHeader[0xda] = '\0';
  abHeader[0xdb] = '\0';
  abHeader[0xdc] = '\0';
  abHeader[0xdd] = '\0';
  abHeader[0xde] = '\0';
  abHeader[0xdf] = '\0';
  abHeader[0xe0] = '\0';
  abHeader[0xe1] = '\0';
  abHeader[0xe2] = '\0';
  abHeader[0xe3] = '\0';
  abHeader[0xe4] = '\0';
  abHeader[0xe5] = '\0';
  abHeader[0xe6] = '\0';
  abHeader[0xe7] = '\0';
  abHeader[200] = '\0';
  abHeader[0xc9] = '\0';
  abHeader[0xca] = '\0';
  abHeader[0xcb] = '\0';
  abHeader[0xcc] = '\0';
  abHeader[0xcd] = '\0';
  abHeader[0xce] = '\0';
  abHeader[0xcf] = '\0';
  abHeader[0xd0] = '\0';
  abHeader[0xd1] = '\0';
  abHeader[0xd2] = '\0';
  abHeader[0xd3] = '\0';
  abHeader[0xd4] = '\0';
  abHeader[0xd5] = '\0';
  abHeader[0xd6] = '\0';
  abHeader[0xd7] = '\0';
  abHeader[0xb8] = '\0';
  abHeader[0xb9] = '\0';
  abHeader[0xba] = '\0';
  abHeader[0xbb] = '\0';
  abHeader[0xbc] = '\0';
  abHeader[0xbd] = '\0';
  abHeader[0xbe] = '\0';
  abHeader[0xbf] = '\0';
  abHeader[0xc0] = '\0';
  abHeader[0xc1] = '\0';
  abHeader[0xc2] = '\0';
  abHeader[0xc3] = '\0';
  abHeader[0xc4] = '\0';
  abHeader[0xc5] = '\0';
  abHeader[0xc6] = '\0';
  abHeader[199] = '\0';
  abHeader[0xa8] = '\0';
  abHeader[0xa9] = '\0';
  abHeader[0xaa] = '\0';
  abHeader[0xab] = '\0';
  abHeader[0xac] = '\0';
  abHeader[0xad] = '\0';
  abHeader[0xae] = '\0';
  abHeader[0xaf] = '\0';
  abHeader[0xb0] = '\0';
  abHeader[0xb1] = '\0';
  abHeader[0xb2] = '\0';
  abHeader[0xb3] = '\0';
  abHeader[0xb4] = '\0';
  abHeader[0xb5] = '\0';
  abHeader[0xb6] = '\0';
  abHeader[0xb7] = '\0';
  abHeader[0x98] = '\0';
  abHeader[0x99] = '\0';
  abHeader[0x9a] = '\0';
  abHeader[0x9b] = '\0';
  abHeader[0x9c] = '\0';
  abHeader[0x9d] = '\0';
  abHeader[0x9e] = '\0';
  abHeader[0x9f] = '\0';
  abHeader[0xa0] = '\0';
  abHeader[0xa1] = '\0';
  abHeader[0xa2] = '\0';
  abHeader[0xa3] = '\0';
  abHeader[0xa4] = '\0';
  abHeader[0xa5] = '\0';
  abHeader[0xa6] = '\0';
  abHeader[0xa7] = '\0';
  abHeader[0x88] = '\0';
  abHeader[0x89] = '\0';
  abHeader[0x8a] = '\0';
  abHeader[0x8b] = '\0';
  abHeader[0x8c] = '\0';
  abHeader[0x8d] = '\0';
  abHeader[0x8e] = '\0';
  abHeader[0x8f] = '\0';
  abHeader[0x90] = '\0';
  abHeader[0x91] = '\0';
  abHeader[0x92] = '\0';
  abHeader[0x93] = '\0';
  abHeader[0x94] = '\0';
  abHeader[0x95] = '\0';
  abHeader[0x96] = '\0';
  abHeader[0x97] = '\0';
  abHeader[0x78] = '\0';
  abHeader[0x79] = '\0';
  abHeader[0x7a] = '\0';
  abHeader[0x7b] = '\0';
  abHeader[0x7c] = '\0';
  abHeader[0x7d] = '\0';
  abHeader[0x7e] = '\0';
  abHeader[0x7f] = '\0';
  abHeader[0x80] = '\0';
  abHeader[0x81] = '\0';
  abHeader[0x82] = '\0';
  abHeader[0x83] = '\0';
  abHeader[0x84] = '\0';
  abHeader[0x85] = '\0';
  abHeader[0x86] = '\0';
  abHeader[0x87] = '\0';
  abHeader[0x68] = '\0';
  abHeader[0x69] = '\0';
  abHeader[0x6a] = '\0';
  abHeader[0x6b] = '\0';
  abHeader[0x6c] = '\0';
  abHeader[0x6d] = '\0';
  abHeader[0x6e] = '\0';
  abHeader[0x6f] = '\0';
  abHeader[0x70] = '\0';
  abHeader[0x71] = '\0';
  abHeader[0x72] = '\0';
  abHeader[0x73] = '\0';
  abHeader[0x74] = '\0';
  abHeader[0x75] = '\0';
  abHeader[0x76] = '\0';
  abHeader[0x77] = '\0';
  abHeader[0x58] = '\0';
  abHeader[0x59] = '\0';
  abHeader[0x5a] = '\0';
  abHeader[0x5b] = '\0';
  abHeader[0x5c] = '\0';
  abHeader[0x5d] = '\0';
  abHeader[0x5e] = '\0';
  abHeader[0x5f] = '\0';
  abHeader[0x60] = '\0';
  abHeader[0x61] = '\0';
  abHeader[0x62] = '\0';
  abHeader[99] = '\0';
  abHeader[100] = '\0';
  abHeader[0x65] = '\0';
  abHeader[0x66] = '\0';
  abHeader[0x67] = '\0';
  abHeader[0x48] = '\0';
  abHeader[0x49] = '\0';
  abHeader[0x4a] = '\0';
  abHeader[0x4b] = '\0';
  abHeader[0x4c] = '\0';
  abHeader[0x4d] = '\0';
  abHeader[0x4e] = '\0';
  abHeader[0x4f] = '\0';
  abHeader[0x50] = '\0';
  abHeader[0x51] = '\0';
  abHeader[0x52] = '\0';
  abHeader[0x53] = '\0';
  abHeader[0x54] = '\0';
  abHeader[0x55] = '\0';
  abHeader[0x56] = '\0';
  abHeader[0x57] = '\0';
  abHeader[0x38] = '\0';
  abHeader[0x39] = '\0';
  abHeader[0x3a] = '\0';
  abHeader[0x3b] = '\0';
  abHeader[0x3c] = '\0';
  abHeader[0x3d] = '\0';
  abHeader[0x3e] = '\0';
  abHeader[0x3f] = '\0';
  abHeader[0x40] = '\0';
  abHeader[0x41] = '\0';
  abHeader[0x42] = '\0';
  abHeader[0x43] = '\0';
  abHeader[0x44] = '\0';
  abHeader[0x45] = '\0';
  abHeader[0x46] = '\0';
  abHeader[0x47] = '\0';
  abHeader[0x28] = '\0';
  abHeader[0x29] = '\0';
  abHeader[0x2a] = '\0';
  abHeader[0x2b] = '\0';
  abHeader[0x2c] = '\0';
  abHeader[0x2d] = '\0';
  abHeader[0x2e] = '\0';
  abHeader[0x2f] = '\0';
  abHeader[0x30] = '\0';
  abHeader[0x31] = '\0';
  abHeader[0x32] = '\0';
  abHeader[0x33] = '\0';
  abHeader[0x34] = '\0';
  abHeader[0x35] = '\0';
  abHeader[0x36] = '\0';
  abHeader[0x37] = '\0';
  builtin_memcpy(abHeader," CPC DSK File\r\nDisk-Info\r\n",0x1b);
  abHeader[0x1b] = '\0';
  abHeader[0x1c] = '\0';
  abHeader[0x1d] = '\0';
  abHeader[0x1e] = '\0';
  abHeader[0x1f] = '\0';
  abHeader[0x20] = '\0';
  abHeader[0x21] = '\0';
  abHeader[0x22] = '\0';
  abHeader[0x23] = '\0';
  abHeader[0x24] = '\0';
  abHeader[0x25] = '\0';
  abHeader[0x26] = '\0';
  abHeader[0x27] = '\0';
  peh = (EDSK_HEADER *)0x0;
  pEVar3 = peh;
  pbIndex = (uint8_t *)&peh;
  max_cyls = (unsigned_long)(abHeader + 0x2c);
  local_150 = 0x66;
  peh._0_1_ = 'E';
  peh._1_1_ = 'X';
  peh._2_1_ = 'T';
  peh._3_1_ = 'E';
  peh._4_1_ = 'N';
  peh._5_1_ = 'D';
  peh._6_1_ = 'E';
  peh._7_1_ = 'D';
  peh = pEVar3;
  util::fmt_abi_cxx11_(&local_170,"SAMdisk%02u%02u%02u",0x19,4);
  __src = (char *)std::__cxx11::string::c_str();
  strncpy((char *)(abHeader + 0x1a),__src,0xe);
  std::__cxx11::string::~string((string *)&local_170);
  peVar12 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)mem.pb
                      );
  iVar7 = Disk::cyls(peVar12);
  pbIndex[0x30] = (uint8_t)iVar7;
  peVar12 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)mem.pb
                      );
  iVar7 = Disk::heads(peVar12);
  pbIndex[0x31] = (uint8_t)iVar7;
  if (local_150 < pbIndex[0x30]) {
    peVar13 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[28]>
              (peVar13,(char (*) [28])"too many cylinders for EDSK");
    __cxa_throw(peVar13,&util::exception::typeinfo,util::exception::~exception);
  }
  if (2 < pbIndex[0x31]) {
    peVar13 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[24]>(peVar13,(char (*) [24])"too many heads for EDSK");
    __cxa_throw(peVar13,&util::exception::typeinfo,util::exception::~exception);
  }
  bVar1 = true;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&cylhead.head);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&cylhead.head,
             (ulong)((pbIndex[0x30] + 1) * (uint)pbIndex[0x31]));
  fseek((FILE *)f_,0x100,0);
  cylhead.cyl._3_1_ = 0;
  do {
    if (pbIndex[0x30] <= cylhead.cyl._3_1_) {
      if ((opt.legacy == 0) && (bVar1)) {
        builtin_strncpy(eo.signature,"nfo\r\n",6);
        eo.signature[6] = '\0';
        local_320 = 0x2d74657366664f;
        uStack_319 = 0x49;
        fwrite(&local_320,0xf,1,(FILE *)f_);
        __ptr = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&cylhead.head)
        ;
        __size = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&cylhead.head
                           );
        fwrite(__ptr,__size,2,(FILE *)f_);
      }
      fseek((FILE *)f_,0,0);
      sVar17 = fwrite(&peh,0x100,1,(FILE *)f_);
      if (sVar17 != 0) {
        fseek((FILE *)f_,0,2);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&cylhead.head);
        MEMORY::~MEMORY((MEMORY *)&pbTrack);
        return true;
      }
      peVar13 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[12]>(peVar13,(char (*) [12])"write error");
      __cxa_throw(peVar13,&util::exception::typeinfo,util::exception::~exception);
    }
    for (cylhead.cyl._2_1_ = 0; cylhead.cyl._2_1_ < pbIndex[0x31];
        cylhead.cyl._2_1_ = cylhead.cyl._2_1_ + 1) {
      CylHead::CylHead((CylHead *)((long)&track + 4),(uint)cylhead.cyl._3_1_,(uint)cylhead.cyl._2_1_
                      );
      peVar12 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                          ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           mem.pb);
      pTStack_1b0 = Disk::read_track(peVar12,(CylHead *)((long)&track + 4),false);
      bVar5 = Track::is_mixed_encoding(pTStack_1b0);
      if (bVar5) {
        peVar13 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<CylHead&,char_const(&)[46]>
                  (peVar13,(CylHead *)((long)&track + 4),
                   (char (*) [46])" is mixed-density, which EDSK doesn\'t support");
        __cxa_throw(peVar13,&util::exception::typeinfo,util::exception::~exception);
      }
      pt._7_1_ = 0;
      uVar11 = pTStack_1b0->tracklen;
      if ((int)uVar11 < 0) {
        uVar11 = uVar11 + 0xf;
      }
      pt._4_2_ = util::htole<unsigned_short>((unsigned_short)(uVar11 >> 4));
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&cylhead.head,
                 (value_type_conflict4 *)((long)&pt + 4));
      uVar4 = mem._8_8_;
      track_00 = pTStack_1b0;
      typical.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)(mem._8_8_ + 0x18);
      datarate = 0;
      track_header_size = 0;
      uStack_250._0_4_ = 0;
      uStack_250._4_4_ = 0;
      Header::Header((Header *)&datarate);
      Sector::Sector(&local_248,Unknown,Unknown,(Header *)&datarate,0);
      GetTypicalSector((Sector *)local_208,(CylHead *)((long)&track + 4),track_00,&local_248);
      Sector::~Sector(&local_248);
      iVar7 = Track::size(pTStack_1b0);
      encoding = iVar7 * 8 + 0x117 & 0xffffff00;
      puVar14 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)&pbTrack);
      memset(puVar14,0,(long)(int)encoding);
      *(undefined8 *)(uVar4 + 5) = 0xa0d6f666e492d;
      *(undefined8 *)uVar4 = 0x6e492d6b63617254;
      *(byte *)(uVar4 + 0x10) = cylhead.cyl._3_1_;
      *(byte *)(uVar4 + 0x11) = cylhead.cyl._2_1_;
      iVar7 = Track::size(pTStack_1b0);
      *(char *)(uVar4 + 0x15) = (char)iVar7;
      *(undefined1 *)(uVar4 + 0x17) = 0xe5;
      iVar7 = Track::size(pTStack_1b0);
      if (iVar7 == 0) {
        local_3b4 = 2;
      }
      else {
        local_3b4 = (undefined1)typical.header.head;
      }
      *(undefined1 *)(uVar4 + 0x14) = local_3b4;
      if (typical.encoding == Unknown) {
        local_3b8 = 0x4e;
      }
      else {
        local_3b8 = (undefined1)typical.encoding;
      }
      *(undefined1 *)(uVar4 + 0x16) = local_3b8;
      iVar7 = Track::size(pTStack_1b0);
      if (iVar7 == 0) {
        local_3cc = Unknown;
      }
      else {
        pSVar15 = Track::operator[](pTStack_1b0,0);
        local_3cc = pSVar15->datarate;
      }
      track_size = local_3cc;
      iVar7 = Track::size(pTStack_1b0);
      if (iVar7 == 0) {
        local_3dc = Unknown;
      }
      else {
        pSVar15 = Track::operator[](pTStack_1b0,0);
        local_3dc = pSVar15->encoding;
      }
      EStack_264 = local_3dc;
      if (track_size == 250000) {
        *(undefined1 *)(uVar4 + 0x12) = 1;
      }
      else if (track_size == 300000) {
        *(undefined1 *)(uVar4 + 0x12) = 1;
      }
      else if (track_size == 500000) {
        *(undefined1 *)(uVar4 + 0x12) = 2;
      }
      else if (track_size == 1000000) {
        *(undefined1 *)(uVar4 + 0x12) = 3;
      }
      else {
        *(undefined1 *)(uVar4 + 0x12) = 0;
      }
      *(bool *)(uVar4 + 0x13) = local_3dc == FM;
      uFitSize = 0;
      bVar18 = opt.legacy != 0;
      bVar5 = false;
      bVar2 = false;
      iVar7 = GetUnformatSizeCode(track_size);
      pb._0_4_ = Sector::SizeCodeToLength(iVar7);
      while (iVar7 = Track::size(pTStack_1b0), iVar7 != 0) {
        uFitSize = encoding;
        puStack_278 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)&pbTrack);
        puStack_278 = puStack_278 + (int)encoding;
        for (sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ < (int)(uint)*(byte *)(uVar4 + 0x15);
            sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ =
                 sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
          pSVar15 = Track::operator[](pTStack_1b0,
                                      sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          Sector::Sector((Sector *)&rpm_time,pSVar15);
          if (sector.datarate == Unknown) {
            bVar1 = false;
          }
          else if ((pt._7_1_ & 1) == 0) {
            DVar8 = sector.datarate;
            if ((int)sector.datarate < 0) {
              DVar8 = sector.datarate + 0xf;
            }
            track_capacity._2_2_ = util::htole<unsigned_short>((unsigned_short)(DVar8 >> 4));
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&cylhead.head,
                       (value_type_conflict4 *)((long)&track_capacity + 2));
          }
          local_2c8 = 200000;
          if (sector.header.sector == 300000) {
            local_2c8 = 0x28b0b;
          }
          local_2cc = GetTrackCapacity(local_2c8,sector.header.sector,sector.header.size);
          if (((char)sector.offset != -5) && ((char)sector.offset != -8)) {
            _num_copies = CHR((uint)cylhead.cyl._3_1_,(uint)cylhead.cyl._2_1_,sector.header.cyl);
            Message<char_const*,unsigned_char&>
                      (msgWarning,"discarding data from %s due to non-standard DAM %02x",
                       (char **)&num_copies,(uchar *)&sector.offset);
            Sector::remove_data((Sector *)&rpm_time);
          }
          data_size._3_1_ = 0;
          data_size._2_1_ = 0;
          bVar6 = Sector::has_badidcrc((Sector *)&rpm_time);
          if (bVar6) {
            data_size._3_1_ = data_size._3_1_ | 0x20;
          }
          bVar6 = Sector::has_badidcrc((Sector *)&rpm_time);
          if ((!bVar6) && (bVar6 = Sector::has_data((Sector *)&rpm_time), !bVar6)) {
            data_size._2_1_ = data_size._2_1_ | 1;
          }
          bVar6 = Sector::has_baddatacrc((Sector *)&rpm_time);
          if (bVar6) {
            data_size._3_1_ = data_size._3_1_ | 0x20;
            data_size._2_1_ = data_size._2_1_ | 0x20;
          }
          bVar6 = Sector::is_deleted((Sector *)&rpm_time);
          if (bVar6) {
            data_size._2_1_ = data_size._2_1_ | 0x40;
          }
          real_size = Sector::copies((Sector *)&rpm_time);
          local_2e4 = Sector::data_size((Sector *)&rpm_time);
          local_2e8 = Sector::size((Sector *)&rpm_time);
          if ((7 < sector.header.head) && ((int)pb < local_2e4)) {
            local_2e4 = (int)pb;
          }
          if ((1 < real_size) && (bVar6 = Track::is_8k_sector(pTStack_1b0), bVar6)) {
            local_2e4 = local_2e8;
          }
          if ((real_size < 2) || (local_2e4 == local_2e8)) {
            if ((local_2cc < local_2e4) && (bVar6 = Track::is_8k_sector(pTStack_1b0), !bVar6)) {
              real_size = 1;
            }
          }
          else {
            if (local_2e8 < local_2e4) {
              local_2f0 = CHR((uint)cylhead.cyl._3_1_,(uint)cylhead.cyl._2_1_,sector.header.cyl);
              Message<char_const*>
                        (msgWarning,"discarding gaps from multiple copies of %s",&local_2f0);
            }
            else if ((sector.datarate != Unknown) &&
                    ((int)(sector.datarate + local_2e8) < pTStack_1b0->tracklen)) {
              pcStack_2f8 = CHR((uint)cylhead.cyl._3_1_,(uint)cylhead.cyl._2_1_,sector.header.cyl);
              Message<char_const*>
                        (msgWarning,"short data field in multiple copies of %s",
                         &stack0xfffffffffffffd08);
            }
            local_2e4 = local_2e8;
          }
          if (((bVar5) && (bVar6 = Sector::has_baddatacrc((Sector *)&rpm_time), bVar6)) &&
             (1 < real_size)) {
            real_size = 1;
          }
          if (((bVar2) && (bVar6 = Sector::has_baddatacrc((Sector *)&rpm_time), bVar6)) &&
             ((int)pb < local_2e4)) {
            local_2e4 = (int)pb;
          }
          if (bVar18) {
            if (1 < real_size) {
              real_size = 1;
            }
            if ((sector.header.head == 6) && (0x1800 < local_2e4)) {
              local_2e4 = 0x1800;
            }
            if (6 < sector.header.head) {
              local_2e4 = 0;
            }
            if (local_2e8 < local_2e4) {
              local_2e4 = local_2e8;
            }
          }
          for (data._4_4_ = 0; data._4_4_ < real_size; data._4_4_ = data._4_4_ + 1) {
            this = &Sector::data_copy((Sector *)&rpm_time,data._4_4_)->
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
            if (uFitSize + local_2e4 < (int)mem._vptr_MEMORY) {
              iVar7 = Data::size((Data *)this);
              if (iVar7 < local_2e4) {
                puVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(this);
                iVar7 = Data::size((Data *)this);
                memcpy(puStack_278,puVar16,(long)iVar7);
                iVar9 = Data::size((Data *)this);
                iVar7 = local_2e4;
                iVar10 = Data::size((Data *)this);
                memset(puStack_278 + iVar9,0,(long)(iVar7 - iVar10));
              }
              else {
                puVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(this);
                memcpy(puStack_278,puVar16,(long)local_2e4);
              }
              if ((((local_2e4 != 0) && (iVar7 = Sector::copies((Sector *)&rpm_time), iVar7 == 1))
                  && (bVar6 = Sector::has_baddatacrc((Sector *)&rpm_time), bVar6)) &&
                 ((local_2e4 != local_2e8 && (local_2e4 % local_2e8 == 0)))) {
                puStack_278[local_2e4] = '{';
                local_2e4 = local_2e4 + 1;
              }
            }
            puStack_278 = puStack_278 + local_2e4;
            uFitSize = local_2e4 + uFitSize;
          }
          *(char *)(&((typical.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start +
                   sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_) = (char)rpm_time;
          *(char *)((long)&((typical.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage)->
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start +
                   (long)sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_ * 8 + 1) = (char)local_2bc;
          *(char *)((long)&((typical.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage)->
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start +
                   (long)sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_ * 8 + 2) =
               (char)sector.header.cyl;
          *(char *)((long)&((typical.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage)->
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start +
                   (long)sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_ * 8 + 3) =
               (char)sector.header.head;
          *(byte *)((long)&((typical.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage)->
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start +
                   (long)sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_ * 8 + 4) = data_size._3_1_;
          *(byte *)((long)&((typical.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage)->
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start +
                   (long)sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_ * 8 + 5) = data_size._2_1_;
          local_2e4 = real_size * local_2e4;
          *(char *)((long)&((typical.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage)->
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start +
                   (long)sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_ * 8 + 6) = (char)local_2e4;
          *(char *)((long)&((typical.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage)->
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start +
                   (long)sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_ * 8 + 7) =
               (char)((uint)local_2e4 >> 8);
          Sector::~Sector((Sector *)&rpm_time);
        }
        if (uFitSize <= (int)mem._vptr_MEMORY) {
          puVar14 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)&pbTrack);
          memset(puVar14 + uFitSize,0,(long)((int)mem._vptr_MEMORY - uFitSize));
          break;
        }
        pt._7_1_ = 1;
        if (bVar5) {
          if (bVar2) {
            if ((int)pb < 0x81) {
              if (bVar18) {
                peVar13 = (exception *)__cxa_allocate_exception(0x10);
                stack0xfffffffffffffcf4 = 0xff00;
                util::exception::
                exception<CylHead&,char_const(&)[8],int&,char_const(&)[29],int,char_const(&)[2]>
                          (peVar13,(CylHead *)((long)&track + 4),(char (*) [8])0x2ad15d,&uFitSize,
                           (char (*) [29])") exceeds EDSK track limit (",(int *)(eo.signature + 0xc)
                           ,(char (*) [2])0x2a8e34);
                __cxa_throw(peVar13,&util::exception::typeinfo,util::exception::~exception);
              }
              bVar18 = true;
            }
            else {
              pb._0_4_ = (int)pb / 2;
            }
          }
          else {
            bVar2 = true;
          }
        }
        else {
          bVar5 = true;
        }
      }
      uVar11 = uFitSize + 0xffU & 0xffffff00;
      uFitSize._1_1_ = (undefined1)(uVar11 >> 8);
      *(undefined1 *)max_cyls = uFitSize._1_1_;
      uFitSize = uVar11;
      max_cyls = max_cyls + 1;
      fwrite((void *)abHeader._248_8_,(long)(int)uVar11,1,(FILE *)f_);
      Sector::~Sector((Sector *)local_208);
    }
    cylhead.cyl._3_1_ = cylhead.cyl._3_1_ + 1;
  } while( true );
}

Assistant:

bool WriteDSK(FILE* f_, std::shared_ptr<Disk>& disk)
{
    MEMORY mem(ESDK_MAX_TRACK_SIZE);
    auto pbTrack = mem.pb;

    uint8_t abHeader[256] = {}; // EDSK file header is fixed at 256 bytes - don't change!
    auto peh = reinterpret_cast<EDSK_HEADER*>(abHeader);
    auto pbIndex = reinterpret_cast<uint8_t*>(peh + 1);
    auto max_cyls = (sizeof(abHeader) - sizeof(EDSK_HEADER)) / MAX_SIDES;

    memcpy(peh->szSignature, EDSK_SIGNATURE, sizeof(EDSK_SIGNATURE) - 1);
    strncpy(peh->szCreator, util::fmt("SAMdisk%02u%02u%02u", YEAR % 100, MONTH + 1, DAY).c_str(), sizeof(peh->szCreator));

    peh->bTracks = static_cast<uint8_t>(disk->cyls());
    peh->bSides = static_cast<uint8_t>(disk->heads());

    if (peh->bTracks > max_cyls)
        throw util::exception("too many cylinders for EDSK");
    else if (peh->bSides > MAX_SIDES)
        throw util::exception("too many heads for EDSK");

    bool add_offsets_block = true;
    std::vector<uint16_t> offsets;
    offsets.reserve((peh->bTracks + 1) * peh->bSides);

    fseek(f_, sizeof(abHeader), SEEK_SET);

    for (uint8_t cyl = 0; cyl < peh->bTracks; ++cyl)
    {
        for (uint8_t head = 0; head < peh->bSides; ++head)
        {
            CylHead cylhead(cyl, head);
            auto& track = disk->read_track(cylhead);

            if (track.is_mixed_encoding())
                throw util::exception(cylhead, " is mixed-density, which EDSK doesn't support");

            bool added_sector_offsets = false;
            offsets.push_back(util::htole(static_cast<uint16_t>(track.tracklen / 16)));

            auto pt = reinterpret_cast<EDSK_TRACK*>(mem.pb);
            auto ps = reinterpret_cast<EDSK_SECTOR*>(pt + 1);

            Sector typical = GetTypicalSector(cylhead, track, Sector(DataRate::Unknown, Encoding::Unknown));

            // The standard track header is 256 bytes, but to allow more than 29 sectors we'll
            // round up the required size to the next 256-byte boundary
            int track_header_size = (sizeof(EDSK_TRACK) + track.size() * sizeof(EDSK_SECTOR) + 0xff) & ~0xff;

            memset(mem, 0, track_header_size);
            memcpy(pt->signature, EDSK_TRACK_SIG, sizeof(pt->signature));
            pt->track = cyl;
            pt->side = head;
            pt->sectors = static_cast<uint8_t>(track.size());
            pt->fill = 0xe5;
            pt->size = static_cast<uint8_t>(track.size() ? typical.header.size : EDSK_DEFAULT_SIZE);
            pt->gap3 = static_cast<uint8_t>(typical.gap3 ? typical.gap3 : EDSK_DEFAULT_GAP3);

            auto datarate = track.size() ? track[0].datarate : DataRate::Unknown;
            auto encoding = track.size() ? track[0].encoding : Encoding::Unknown;

            switch (datarate)
            {
            default:                pt->rate = 0;   break;
            case DataRate::_250K:   pt->rate = 1;   break;
            case DataRate::_300K:   pt->rate = 1;   break;
            case DataRate::_500K:   pt->rate = 2;   break;
            case DataRate::_1M:     pt->rate = 3;   break;
            }

            pt->encoding = (encoding == Encoding::FM) ? 1 : 0;

            // Assume 300rpm to determine approximate track capacity
            auto track_size = 0;

            // Space saving flags, to squeeze the track into the limited EDSK space
            bool fFitLegacy = !!opt.legacy;
            bool fFitErrorCopies = false, fFitErrorSize = false;
            auto uFitSize = Sector::SizeCodeToLength(GetUnformatSizeCode(datarate));

            // Loop to fit any sectors
            while (track.size())
            {
                // Start with the size of the track header
                track_size = track_header_size;

                // Point to the start of the data area and the sector space
                auto pb = mem + track_header_size;

                for (int i = 0; i < pt->sectors; ++i)
                {
                    auto sector = track[i];

                    // If any offsets are zero we can't generate append an offsets block.
                    if (!sector.offset)
                        add_offsets_block = false;
                    // Take care to only output offsets on the first pass around the fitting loop.
                    else if (!added_sector_offsets)
                        offsets.push_back(util::htole(static_cast<uint16_t>(sector.offset / 16)));

                    auto rpm_time = (sector.datarate == DataRate::_300K) ? RPM_TIME_360 : RPM_TIME_300;
                    auto track_capacity = GetTrackCapacity(rpm_time, sector.datarate, sector.encoding);

                    // Accept only normal and deleted DAMs, removing the data field for other types.
                    // Hercule II (CPC) has a non-standard DAM (0xFD), and expects it to be unreadable.
                    if (sector.dam != 0xfb && sector.dam != 0xf8)
                    {
                        Message(msgWarning, "discarding data from %s due to non-standard DAM %02x",
                            CHR(cyl, head, sector.header.sector), sector.dam);
                        sector.remove_data();
                    }

                    uint8_t status1 = 0, status2 = 0;
                    if (sector.has_badidcrc()) status1 |= SR1_CRC_ERROR;
                    if (!sector.has_badidcrc() && !sector.has_data()) status2 |= SR2_MISSING_ADDRESS_MARK;
                    if (sector.has_baddatacrc()) { status1 |= SR1_CRC_ERROR; status2 |= SR2_CRC_ERROR_IN_SECTOR_DATA; }
                    if (sector.is_deleted()) status2 |= SR2_SECTOR_WITH_DELETED_DATA;

                    auto num_copies = sector.copies();
                    auto data_size = sector.data_size();
                    auto real_size = sector.size();

                    // Clip extended sizes to the unformat size, to ensure we have a complete revolution
                    if (sector.header.size > 7 && data_size > uFitSize)
                        data_size = uFitSize;

                    // Preserve multiple copies on 8K tracks by extending them to full size
                    if (num_copies > 1 && track.is_8k_sector())
                        data_size = real_size;

                    // Warn if other error sectors are shorter than real size
                    if (num_copies > 1 && data_size != real_size)
                    {
                        if (data_size > real_size)
                            Message(msgWarning, "discarding gaps from multiple copies of %s", CHR(cyl, head, sector.header.sector));
                        else if (sector.offset && sector.offset + real_size < track.tracklen)
                            Message(msgWarning, "short data field in multiple copies of %s", CHR(cyl, head, sector.header.sector));

                        data_size = real_size;
                    }

                    // Drop extra copies on sectors larger than the track, unless it's
                    // an 8K sector with an error during the first 6K of data.
                    else if (data_size > track_capacity && !track.is_8k_sector())
                        num_copies = 1;

                    // Drop any extra copies of error sectors
                    if (fFitErrorCopies)
                    {
                        if (sector.has_baddatacrc() && num_copies > 1)
                            num_copies = 1;
                    }

                    // Cut extended sectors down to zero data
                    if (fFitErrorSize)
                    {
                        if (sector.has_baddatacrc() && data_size > uFitSize)
                            data_size = uFitSize;
                    }

                    // Force to legacy format?
                    if (fFitLegacy)
                    {
                        if (num_copies > 1) num_copies = 1;
                        if (sector.header.size == 6 && data_size > 6144) data_size = 6144;
                        if (sector.header.size >= 7) data_size = 0;
                        if (data_size > real_size) data_size = real_size;
                    }

                    // Copy the sector data into place
                    for (auto copy = 0; copy < num_copies; ++copy)
                    {
                        const Data& data = sector.data_copy(copy);

                        // Only copy if there's room - we'll check it fits later
                        if (track_size + data_size < mem.size)
                        {
                            if (data.size() >= data_size)
                                memcpy(pb, data.data(), data_size);
                            else
                            {
                                // Extend 8K sectors to full size to preserve multiple copies
                                memcpy(pb, data.data(), data.size());
                                memset(pb + data.size(), 0, data_size - data.size());
                            }

                            // Single copy data CRC error and size that conflicts with multiple copies extension?
                            if (data_size && sector.copies() == 1 && sector.has_baddatacrc() &&
                                data_size != real_size && (data_size % real_size) == 0)
                            {
                                // Write a dummy marker byte to the end of the data, and increment the stored size
                                pb[data_size++] = 123;
                            }
                        }

                        pb += data_size;
                        track_size += data_size;
                    }

                    ps[i].track = static_cast<uint8_t>(sector.header.cyl);
                    ps[i].side = static_cast<uint8_t>(sector.header.head);
                    ps[i].sector = static_cast<uint8_t>(sector.header.sector);
                    ps[i].size = static_cast<uint8_t>(sector.header.size);
                    ps[i].status1 = status1;
                    ps[i].status2 = status2;

                    data_size *= num_copies;
                    ps[i].datalow = data_size & 0xff;
                    ps[i].datahigh = static_cast<uint8_t>(data_size >> 8);
                }

                // If the track fits, we're done
                if (track_size <= mem.size)
                {
                    // Clear any unused space, then break out to save it
                    memset(mem + track_size, 0, mem.size - track_size);
                    break;
                }

                // Flag that sector offsets have already been generated.
                added_sector_offsets = true;

                // Try again using various techniques to make it fit
                if (!fFitErrorCopies) { fFitErrorCopies = true; continue; }
                if (!fFitErrorSize) { fFitErrorSize = true; continue; }
                if (uFitSize > 128) { uFitSize /= 2; continue; }
                if (!fFitLegacy) { fFitLegacy = true; continue; }

                // If we run out of methods, fail
                throw util::exception(cylhead, " size (", track_size, ") exceeds EDSK track limit (", ESDK_MAX_TRACK_SIZE, ")");
            }

            // Round the size up to the next 256-byte boundary, and store the MSB in the index
            track_size = (track_size + 0xff) & ~0xff;
            *pbIndex++ = static_cast<uint8_t>(track_size >> 8);

            // Write the track to the image
            fwrite(pbTrack, track_size, 1, f_);
        }
    }

    // Add offsets if available, unless they're disabled
    if (!opt.legacy && add_offsets_block)
    {
        EDSK_OFFSETS eo = { EDSK_OFFSETS_SIG, 0 };
        fwrite(&eo, sizeof(eo), 1, f_);
        fwrite(offsets.data(), offsets.size(), sizeof(uint16_t), f_);
    }

    fseek(f_, 0, SEEK_SET);
    if (!fwrite(abHeader, sizeof(abHeader), 1, f_))
        throw util::exception("write error");
    fseek(f_, 0, SEEK_END);

    return true;
}